

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::CaseAssertionExpr::serializeTo(CaseAssertionExpr *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  AssertionExpr *__n;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  Expression *local_88;
  Expression *ex;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  iterator local_58;
  ItemGroup *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  CaseAssertionExpr *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"expr");
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,(size_t)this->expr);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"items");
  ASTSerializer::startArray(pAVar1,___range2);
  __begin2 = (iterator)&this->items;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>
                       *)__begin2);
  item = nonstd::span_lite::
         span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::end
                   ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                    __begin2);
  for (; __end2 != item; __end2 = __end2 + 1) {
    local_58 = __end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"expressions");
    ASTSerializer::startArray(pAVar1,___range3);
    __begin3 = (iterator)local_58;
    __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
             begin(&local_58->expressions);
    ex = (Expression *)
         nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin3);
    for (; (Expression *)__end3 != ex; __end3 = __end3 + 1) {
      local_88 = *__end3;
      ASTSerializer::serialize(local_18,local_88);
    }
    ASTSerializer::endArray(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"body");
    __n = not_null<const_slang::ast::AssertionExpr_*>::operator*(&local_58->body);
    ASTSerializer::write(pAVar1,(int)local_98._M_len,local_98._M_str,(size_t)__n);
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  if (this->defaultCase != (AssertionExpr *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a8,"defaultCase");
    ASTSerializer::write(pAVar1,(int)local_a8._M_len,local_a8._M_str,(size_t)this->defaultCase);
  }
  return;
}

Assistant:

void CaseAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);

    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions)
            serializer.serialize(*ex);
        serializer.endArray();

        serializer.write("body", *item.body);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase)
        serializer.write("defaultCase", *defaultCase);
}